

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

char * tls_rt_type(int type,void *buf,size_t buflen)

{
  size_t buflen_local;
  void *buf_local;
  char *pcStack_10;
  int type_local;
  
  buf_local._4_4_ = type;
  if (((type == 0x101) && (buf != (void *)0x0)) && (buflen != 0)) {
    buf_local._4_4_ = (uint)*buf;
  }
  if (buf_local._4_4_ == 0x14) {
    pcStack_10 = "TLS change cipher";
  }
  else if (buf_local._4_4_ == 0x15) {
    pcStack_10 = "TLS alert";
  }
  else if (buf_local._4_4_ == 0x16) {
    pcStack_10 = "TLS handshake";
  }
  else if (buf_local._4_4_ == 0x17) {
    pcStack_10 = "TLS app data";
  }
  else if (buf_local._4_4_ == 0x100) {
    pcStack_10 = "TLS header";
  }
  else {
    pcStack_10 = "TLS Unknown";
  }
  return pcStack_10;
}

Assistant:

static const char *tls_rt_type(int type, const void *buf, size_t buflen)
{
  (void)buf;
  (void)buflen;
#ifdef SSL3_RT_INNER_CONTENT_TYPE
  if(type == SSL3_RT_INNER_CONTENT_TYPE && buf && buflen >= 1)
    type = *(unsigned char *)buf;
#endif

  switch(type) {
#ifdef SSL3_RT_HEADER
  case SSL3_RT_HEADER:
    return "TLS header";
#endif
  case SSL3_RT_CHANGE_CIPHER_SPEC:
    return "TLS change cipher";
  case SSL3_RT_ALERT:
    return "TLS alert";
  case SSL3_RT_HANDSHAKE:
    return "TLS handshake";
  case SSL3_RT_APPLICATION_DATA:
    return "TLS app data";
  default:
    return "TLS Unknown";
  }
}